

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CRef CVar4;
  Lit _l;
  Lit *pLVar5;
  uint *puVar6;
  Watcher *pWVar7;
  Lit *pLVar8;
  vec<Minisat::Watcher> *this_00;
  long in_RDI;
  int k_2;
  int nLevel;
  int nInd;
  int nMaxInd;
  int nMaxLevel;
  int k_1;
  int avoidLevel;
  int watchPos;
  Watcher w;
  Lit first;
  Lit false_lit;
  Clause *c;
  CRef cr;
  Lit blocker;
  Lit the_other;
  int k;
  vec<Minisat::Watcher> *ws_bin;
  Clause *new_conflict_1;
  Clause *new_conflict;
  Watcher *end;
  Watcher *j;
  Watcher *i;
  vec<Minisat::Watcher> *ws;
  int currLevel;
  Lit p;
  CRef old_reason;
  Lit old_trail_top;
  int num_props;
  CRef confl;
  undefined4 in_stack_fffffffffffffd98;
  Ref in_stack_fffffffffffffd9c;
  Solver *in_stack_fffffffffffffda0;
  Solver *in_stack_fffffffffffffda8;
  Lit in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  bool local_209;
  CRef in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  Solver *in_stack_fffffffffffffe18;
  Lit in_stack_fffffffffffffe24;
  int local_1bc;
  watchItem local_1a4;
  lbool local_195;
  int local_194;
  lbool local_18d;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  lbool local_171;
  int local_170;
  lbool local_169;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  watchItem local_158;
  lbool local_149;
  int local_148;
  lbool local_141;
  int local_140;
  lbool local_139;
  int local_138;
  uint8_t local_131;
  int local_130;
  int local_12c;
  int local_128;
  lbool local_121;
  int local_120;
  lbool local_119;
  int local_118;
  int local_114;
  Watcher local_110;
  Lit local_108;
  int local_104;
  int local_100;
  Lit local_fc;
  Clause *local_f8;
  CRef local_ec;
  lbool local_e5;
  int local_e4;
  lbool local_dd;
  Lit local_dc;
  int local_d8;
  lbool local_d1;
  int local_d0;
  lbool local_ca;
  lbool local_c9;
  int local_c8;
  lbool local_c1;
  int local_c0;
  int local_bc;
  vec<Minisat::Watcher> *local_b8;
  lbool local_a9;
  int local_a8;
  lbool local_a1;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  Clause *local_90;
  lbool local_81;
  int local_80;
  lbool local_79;
  int local_78;
  Lit local_74;
  Clause *local_70;
  lbool local_61;
  int local_60;
  lbool local_59;
  int local_58;
  int local_54;
  undefined4 local_50;
  int local_4c;
  Watcher *local_48;
  Watcher *local_40;
  Watcher *local_38;
  vec<Minisat::Watcher> *local_30;
  int local_24;
  int local_20;
  Lit local_1c;
  CRef local_18;
  Lit local_14;
  int local_10;
  CRef local_c;
  
  local_c = 0xffffffff;
  local_10 = 0;
  vec<Minisat::Solver::watchItem>::clear
            ((vec<Minisat::Solver::watchItem> *)in_stack_fffffffffffffda0,
             SUB41(in_stack_fffffffffffffd9c >> 0x18,0));
  local_14.x = -2;
  local_18 = 0xffffffff;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x));
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            ((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x));
  do {
    iVar3 = *(int *)(in_RDI + 0x380);
    iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
    if (iVar2 <= iVar3) {
LAB_00131034:
      local_1bc = 0;
      while (iVar3 = local_1bc,
            iVar2 = vec<Minisat::Solver::watchItem>::size
                              ((vec<Minisat::Solver::watchItem> *)(in_RDI + 0x218)), iVar3 < iVar2)
      {
        this_00 = (vec<Minisat::Watcher> *)(in_RDI + 0x2e8);
        vec<Minisat::Solver::watchItem>::operator[]
                  ((vec<Minisat::Solver::watchItem> *)(in_RDI + 0x218),local_1bc);
        in_stack_fffffffffffffda8 =
             (Solver *)
             OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
             operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                         *)CONCAT44(iVar3,in_stack_fffffffffffffdb0.x),
                        (Lit *)in_stack_fffffffffffffda8);
        vec<Minisat::Solver::watchItem>::operator[]
                  ((vec<Minisat::Solver::watchItem> *)(in_RDI + 0x218),local_1bc);
        vec<Minisat::Watcher>::push
                  (this_00,(Watcher *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
        ;
        local_1bc = local_1bc + 1;
      }
      *(long *)(in_RDI + 0xe8) = (long)local_10 + *(long *)(in_RDI + 0xe8);
      *(long *)(in_RDI + 0x3b8) = *(long *)(in_RDI + 0x3b8) - (long)local_10;
      return local_c;
    }
    iVar3 = *(int *)(in_RDI + 0x380);
    *(int *)(in_RDI + 0x380) = iVar3 + 1;
    pLVar5 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x350),iVar3);
    local_24 = pLVar5->x;
    local_1c.x = local_24;
    var((Lit)local_24);
    local_20 = level(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
    local_30 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
               operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                           *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x),
                          (Lit *)in_stack_fffffffffffffda8);
    local_10 = local_10 + 1;
    if ((*(byte *)(in_RDI + 900) & 1) != 0) {
      iVar3 = *(int *)(in_RDI + 0x388);
      iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x390));
      if (iVar3 < iVar2) {
        pLVar5 = vec<Minisat::Lit>::operator[]
                           ((vec<Minisat::Lit> *)(in_RDI + 0x390),*(int *)(in_RDI + 0x388));
        local_4c = pLVar5->x;
        local_14.x = local_4c;
        iVar3 = var((Lit)local_4c);
        puVar6 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x3a0),iVar3);
        local_18 = *puVar6;
      }
      local_50 = 0xfffffffe;
      bVar1 = Lit::operator!=(&local_14,(Lit)0xfffffffe);
      if (bVar1) {
        local_54 = local_14.x;
        bVar1 = Lit::operator==(&local_1c,local_14);
        if (bVar1) {
          while( true ) {
            in_stack_fffffffffffffe24.x = *(int *)(in_RDI + 0x388);
            iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x390));
            if (iVar3 + -1 <= in_stack_fffffffffffffe24.x) break;
            *(int *)(in_RDI + 0x388) = *(int *)(in_RDI + 0x388) + 1;
            pLVar5 = vec<Minisat::Lit>::operator[]
                               ((vec<Minisat::Lit> *)(in_RDI + 0x390),*(int *)(in_RDI + 0x388));
            local_58 = pLVar5->x;
            in_stack_fffffffffffffe18 = (Solver *)(in_RDI + 0x3a0);
            local_14.x = local_58;
            iVar3 = var((Lit)local_58);
            puVar6 = vec<unsigned_int>::operator[]
                               ((vec<unsigned_int> *)in_stack_fffffffffffffe18,iVar3);
            local_18 = *puVar6;
            if (local_18 == 0xffffffff) break;
            local_60 = local_14.x;
            local_59 = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
            lbool::lbool(&local_61,'\x01');
            bVar1 = lbool::operator==(&local_59,local_61);
            if (bVar1) {
              local_70 = ClauseAllocator::operator[]
                                   ((ClauseAllocator *)in_stack_fffffffffffffda0,
                                    in_stack_fffffffffffffd9c);
              iVar3 = Clause::size(local_70);
              in_stack_fffffffffffffe14 = in_stack_fffffffffffffe14 & 0xffffff;
              if (iVar3 != 2) {
                local_74 = Clause::operator[](local_70,0);
                local_78 = local_14.x;
                bVar1 = Lit::operator!=(&local_74,local_14);
                in_stack_fffffffffffffe14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe14);
              }
              if ((char)(in_stack_fffffffffffffe14 >> 0x18) == '\0') {
                local_c = local_18;
                *(long *)(in_RDI + 0x140) = *(long *)(in_RDI + 0x140) + 1;
                goto LAB_00131034;
              }
              reset_old_trail((Solver *)
                              CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x));
              break;
            }
            local_80 = local_14.x;
            local_79 = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
            lbool::lbool(&local_81,'\x02');
            bVar1 = lbool::operator==(&local_79,local_81);
            if (bVar1) {
              local_90 = ClauseAllocator::operator[]
                                   ((ClauseAllocator *)in_stack_fffffffffffffda0,
                                    in_stack_fffffffffffffd9c);
              iVar3 = Clause::size(local_90);
              if (iVar3 != 2) {
                pLVar5 = Clause::operator[](local_90,0);
                local_94 = local_14.x;
                bVar1 = Lit::operator!=(pLVar5,local_14);
                if (bVar1) {
                  reset_old_trail((Solver *)
                                  CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x));
                  break;
                }
              }
              *(long *)(in_RDI + 0x140) = *(long *)(in_RDI + 0x140) + 1;
              local_98 = local_14.x;
              decisionLevel((Solver *)0x1303e4);
              uncheckedEnqueue(in_stack_fffffffffffffe18,in_stack_fffffffffffffe24,
                               in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
            }
          }
        }
        else {
          local_9c = local_1c.x;
          in_stack_fffffffffffffe10 = var(local_1c);
          local_a0 = local_14.x;
          CVar4 = var(local_14);
          in_stack_fffffffffffffe14 =
               CONCAT13((char)(in_stack_fffffffffffffe14 >> 0x18),
                        CONCAT12(1,(short)in_stack_fffffffffffffe14));
          if (in_stack_fffffffffffffe10 != CVar4) {
            local_a8 = local_14.x;
            local_a1 = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
            lbool::lbool(&local_a9,'\x01');
            bVar1 = lbool::operator==(&local_a1,local_a9);
            in_stack_fffffffffffffe14 =
                 CONCAT13((char)(in_stack_fffffffffffffe14 >> 0x18),
                          CONCAT12(bVar1,(short)in_stack_fffffffffffffe14));
          }
          if ((char)(in_stack_fffffffffffffe14 >> 0x10) != '\0') {
            reset_old_trail((Solver *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x));
          }
        }
      }
    }
    local_b8 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
               operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                           *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x),
                          (Lit *)in_stack_fffffffffffffda8);
    for (local_bc = 0; iVar3 = local_bc, iVar2 = vec<Minisat::Watcher>::size(local_b8),
        iVar3 < iVar2; local_bc = local_bc + 1) {
      pWVar7 = vec<Minisat::Watcher>::operator[](local_b8,local_bc);
      local_c8 = (pWVar7->blocker).x;
      local_c0 = local_c8;
      local_c1 = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
      lbool::lbool(&local_c9,'\x01');
      bVar1 = lbool::operator==(&local_c1,local_c9);
      if (bVar1) {
        pWVar7 = vec<Minisat::Watcher>::operator[](local_b8,local_bc);
        local_c = pWVar7->cref;
        goto LAB_00131034;
      }
      local_d0 = local_c0;
      local_ca = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
      lbool::lbool(&local_d1,'\x02');
      bVar1 = lbool::operator==(&local_ca,local_d1);
      if (bVar1) {
        local_d8 = local_c0;
        vec<Minisat::Watcher>::operator[](local_b8,local_bc);
        uncheckedEnqueue(in_stack_fffffffffffffe18,in_stack_fffffffffffffe24,
                         in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
      }
    }
    pWVar7 = Minisat::vec::operator_cast_to_Watcher_((vec *)local_30);
    local_40 = pWVar7;
    local_38 = pWVar7;
    iVar3 = vec<Minisat::Watcher>::size(local_30);
    local_48 = pWVar7 + iVar3;
    while (local_38 != local_48) {
      local_e4 = (local_38->blocker).x;
      local_dc.x = local_e4;
      local_dd = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
      lbool::lbool(&local_e5,'\0');
      bVar1 = lbool::operator==(&local_dd,local_e5);
      if (bVar1) {
        *local_40 = *local_38;
        local_40 = local_40 + 1;
        local_38 = local_38 + 1;
      }
      else {
        local_ec = local_38->cref;
        local_f8 = ClauseAllocator::operator[]
                             ((ClauseAllocator *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c
                             );
        *(long *)(in_RDI + 0x208) = *(long *)(in_RDI + 0x208) + 1;
        local_100 = local_1c.x;
        local_fc = operator~(local_1c);
        pLVar5 = Clause::operator[](local_f8,0);
        local_104 = local_fc.x;
        bVar1 = Lit::operator==(pLVar5,local_fc);
        if (bVar1) {
          pLVar5 = Clause::operator[](local_f8,1);
          pLVar8 = Clause::operator[](local_f8,0);
          pLVar8->x = pLVar5->x;
          pLVar5 = Clause::operator[](local_f8,1);
          pLVar5->x = local_fc.x;
        }
        local_38 = local_38 + 1;
        pLVar5 = Clause::operator[](local_f8,0);
        local_114 = pLVar5->x;
        local_108.x = local_114;
        Watcher::Watcher(&local_110,local_ec,(Lit)local_114);
        local_118 = local_dc.x;
        bVar1 = Lit::operator!=(&local_108,local_dc);
        local_209 = false;
        if (bVar1) {
          local_120 = local_108.x;
          local_119 = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
          lbool::lbool(&local_121,'\0');
          local_209 = lbool::operator==(&local_119,local_121);
        }
        if (local_209 == false) {
          local_128 = 0;
          local_12c = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x3c0));
          for (local_130 = 2; iVar3 = local_130, iVar2 = Clause::size(local_f8), iVar3 < iVar2;
              local_130 = local_130 + 1) {
            pLVar5 = Clause::operator[](local_f8,local_130);
            local_138 = pLVar5->x;
            local_131 = (uint8_t)value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
            lbool::lbool(&local_139,'\x01');
            bVar1 = lbool::operator!=((lbool *)CONCAT44(in_stack_fffffffffffffd9c,
                                                        in_stack_fffffffffffffd98),
                                      (lbool)(uint8_t)((ulong)in_stack_fffffffffffffda0 >> 0x38));
            if (bVar1) {
              local_128 = local_130;
              pLVar5 = Clause::operator[](local_f8,local_130);
              local_140 = pLVar5->x;
              var((Lit)local_140);
              iVar3 = level(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
              if (local_12c < iVar3) break;
            }
          }
          if (local_128 == 0) {
            *local_40 = local_110;
            local_170 = local_108.x;
            local_40 = local_40 + 1;
            local_169 = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
            lbool::lbool(&local_171,'\x01');
            bVar1 = lbool::operator==(&local_169,local_171);
            iVar3 = local_20;
            if (bVar1) {
              local_c = local_ec;
              iVar3 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
              *(int *)(in_RDI + 0x380) = iVar3;
              while (local_38 < local_48) {
                *local_40 = *local_38;
                local_40 = local_40 + 1;
                local_38 = local_38 + 1;
              }
            }
            else {
              iVar2 = decisionLevel((Solver *)0x130d32);
              if (iVar3 == iVar2) {
                local_178 = local_108.x;
                uncheckedEnqueue(in_stack_fffffffffffffe18,in_stack_fffffffffffffe24,
                                 in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
              }
              else {
                local_17c = local_20;
                local_180 = 1;
                for (local_184 = 2; iVar3 = local_184, iVar2 = Clause::size(local_f8), iVar3 < iVar2
                    ; local_184 = local_184 + 1) {
                  pLVar5 = Clause::operator[](local_f8,local_184);
                  local_18c = pLVar5->x;
                  var((Lit)local_18c);
                  local_188 = level(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
                  if (local_17c < local_188) {
                    local_180 = local_184;
                    local_17c = local_188;
                  }
                }
                if (local_180 != 1) {
                  pLVar5 = Clause::operator[](local_f8,1);
                  pLVar8 = Clause::operator[](local_f8,local_180);
                  std::swap<Minisat::Lit>(pLVar5,pLVar8);
                  local_40 = local_40 + -1;
                  pLVar5 = Clause::operator[](local_f8,1);
                  local_194 = pLVar5->x;
                  local_18d = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
                  lbool::lbool(&local_195,'\0');
                  bVar1 = lbool::operator==(&local_18d,local_195);
                  if (bVar1) {
                    pLVar5 = Clause::operator[](local_f8,1);
                    _l = operator~(pLVar5->x);
                    watchItem::watchItem(&local_1a4,&local_110,_l);
                    vec<Minisat::Solver::watchItem>::push
                              ((vec<Minisat::Solver::watchItem> *)in_stack_fffffffffffffda0,
                               (watchItem *)
                               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                  }
                  else {
                    pLVar5 = Clause::operator[](local_f8,1);
                    operator~((Lit)pLVar5->x);
                    OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                    ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                                  *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x),
                                 (Lit *)in_stack_fffffffffffffda8);
                    vec<Minisat::Watcher>::push
                              ((vec<Minisat::Watcher> *)in_stack_fffffffffffffda0,
                               (Watcher *)
                               CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                  }
                }
                uncheckedEnqueue(in_stack_fffffffffffffe18,in_stack_fffffffffffffe24,
                                 in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
              }
            }
          }
          else {
            pLVar5 = Clause::operator[](local_f8,local_128);
            pLVar8 = Clause::operator[](local_f8,1);
            pLVar8->x = pLVar5->x;
            pLVar5 = Clause::operator[](local_f8,local_128);
            pLVar5->x = local_fc.x;
            pLVar5 = Clause::operator[](local_f8,1);
            local_148 = pLVar5->x;
            local_141 = value(in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0);
            lbool::lbool(&local_149,'\0');
            bVar1 = lbool::operator==(&local_141,local_149);
            if (bVar1) {
              pLVar5 = Clause::operator[](local_f8,1);
              local_160 = pLVar5->x;
              local_15c = (int)operator~((Lit)local_160);
              watchItem::watchItem(&local_158,&local_110,(Lit)local_15c);
              vec<Minisat::Solver::watchItem>::push
                        ((vec<Minisat::Solver::watchItem> *)in_stack_fffffffffffffda0,
                         (watchItem *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
              ;
            }
            else {
              pLVar5 = Clause::operator[](local_f8,1);
              local_168 = pLVar5->x;
              local_164 = (int)operator~((Lit)local_168);
              OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::
              operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>
                          *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0.x),
                         (Lit *)in_stack_fffffffffffffda8);
              vec<Minisat::Watcher>::push
                        ((vec<Minisat::Watcher> *)in_stack_fffffffffffffda0,
                         (Watcher *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
            }
          }
        }
        else {
          *local_40 = local_110;
          local_40 = local_40 + 1;
        }
      }
    }
    vec<Minisat::Watcher>::shrink(local_30,(int)((long)local_38 - (long)local_40 >> 3));
  } while( true );
}

Assistant:

CRef Solver::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    lazySATwatch.clear();
    Lit old_trail_top = lit_Undef;
    CRef old_reason = CRef_Undef;
    watches.cleanAll();
    watches_bin.cleanAll();

    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        int currLevel = level(var(p));
        vec<Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;

        /* begin old trail reconstruction */
        if (use_backuped_trail) {
            if (old_trail_qhead < old_trail.size()) {
                old_trail_top = old_trail[old_trail_qhead];
                old_reason = oldreasons[var(old_trail_top)];
            }
            if (old_trail_top != lit_Undef) {
                if (p == old_trail_top) {
                    while (old_trail_qhead < old_trail.size() - 1) {
                        old_trail_qhead++;
                        old_trail_top = old_trail[old_trail_qhead];
                        old_reason = oldreasons[var(old_trail_top)];
                        if (old_reason == CRef_Undef) {
                            break;
                        } else if (value(old_trail_top) == l_False) {
                            const Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will hit a conflict here, the clause is just not structured correctly yet,
                                nor watched correctly. */
                                reset_old_trail();
                                break;
                            }
                            confl = old_reason;
                            used_backup_lits++;
                            TRACE(std::cout
                                  << "c prop: hit conflict during trail restoring, when trying to propagate literal "
                                  << old_trail_top << " with reason[" << old_reason << "] " << new_conflict << std::endl;);
                            assert((new_conflict.size() == 2 || new_conflict[0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            /* No need to touch watch lists, we will backtrack this level anyways! */
                            goto propagation_out;
                        } else if (value(old_trail_top) == l_Undef) {
                            Clause &new_conflict = ca[old_reason];
                            if (new_conflict.size() != 2 && new_conflict[0] != old_trail_top) {
                                /* We will use this unit clause, the clause is just not structured correctly yet */
                                reset_old_trail();
                                break;
                            }
                            used_backup_lits++;
                            TRACE(std::cout << "c prop: enqueue literal " << old_trail_top << " with reason["
                                            << old_reason << "] " << ca[old_reason] << std::endl;);
                            assert((ca[old_reason].size() == 2 || ca[old_reason][0] == old_trail_top) &&
                                   "asserting literal is at position 1");
                            uncheckedEnqueue(old_trail_top, decisionLevel(), old_reason);
                        }
                    }
                } else if (var(p) == var(old_trail_top) || value(old_trail_top) == l_False) {
                    reset_old_trail();
                }
            }
        }
        /* end old trail reconstruction */

        vec<Watcher> &ws_bin = watches_bin[p]; // Propagate binary clauses first.
        for (int k = 0; k < ws_bin.size(); k++) {
            Lit the_other = ws_bin[k].blocker;
            if (value(the_other) == l_False) {
                confl = ws_bin[k].cref;
                goto propagation_out;
            } else if (value(the_other) == l_Undef) {
                uncheckedEnqueue(the_other, currLevel, ws_bin[k].cref);
#ifdef PRINT_OUT
                std::cout << "i " << the_other << " l " << currLevel << "\n";
#endif
            }
        }

        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            statistics.solveSteps++;
            const Lit false_lit = ~p;
            if (c[0] == false_lit) c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            const Lit first = c[0];
            const Watcher w = Watcher(cr, first);
            if (first != blocker && value(first) == l_True) {
                *j++ = w;
                continue;
            }

            // Look for new watch:
            int watchPos = 0, avoidLevel = assumptions.size();
            for (int k = 2; k < c.size(); k++) {
                if (value(c[k]) != l_False) {
                    watchPos = k; /* memorize that we found one literal we can watch */
                    if (level(var(c[k])) > avoidLevel) break;
                }
            }

            /* found a position to watch, watch the clause */
            if (watchPos != 0) {
                c[1] = c[watchPos];
                c[watchPos] = false_lit;
                if (value(c[1]) == l_True) {
                    lazySATwatch.push(watchItem(w, ~c[1]));
                } else {
                    watches[~c[1]].push(w);
                }
                goto NextClause;
            }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) *j++ = *i++;
            } else {
                if (currLevel == decisionLevel()) {
                    uncheckedEnqueue(first, currLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << currLevel << "\n";
#endif
                } else {
                    int nMaxLevel = currLevel;
                    int nMaxInd = 1;
                    // pass over all the literals in the clause and find the one with the biggest level
                    for (int nInd = 2; nInd < c.size(); ++nInd) {
                        int nLevel = level(var(c[nInd]));
                        if (nLevel > nMaxLevel) {
                            nMaxLevel = nLevel;
                            nMaxInd = nInd;
                        }
                    }

                    if (nMaxInd != 1) {
                        std::swap(c[1], c[nMaxInd]);
                        j--; // undo last watch
                        if (value(c[1]) == l_True) {
                            lazySATwatch.push(watchItem(w, ~c[1]));
                        } else {
                            watches[~c[1]].push(w);
                        }
                    }

                    uncheckedEnqueue(first, nMaxLevel, cr);
#ifdef PRINT_OUT
                    std::cout << "i " << first << " l " << nMaxLevel << "\n";
#endif
                }
            }

        NextClause:;
        }
        ws.shrink(i - j);
    }

propagation_out:;
    /* we still need to re-add the satisfied clauses to their respective watch lists - in order! */
    for (int k = 0; k < lazySATwatch.size(); ++k) {
        watches[lazySATwatch[k].l].push(lazySATwatch[k].w);
    }

    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}